

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

bool tfs::subsample(Matrix *dstMatrix,Matrix *srcMatrix,unsigned_long da,unsigned_long db)

{
  bool bVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  ulong uVar10;
  double *pdVar11;
  TMatrix<double> *this;
  ulong in_RCX;
  long in_RDX;
  TMatrix<double> *in_RSI;
  TMatrix<double> *in_RDI;
  unsigned_long aa_2;
  DNN_NUMERIC *src_2;
  unsigned_long srcIndex_2;
  unsigned_long bb_2;
  unsigned_long cc_1;
  unsigned_long dd;
  unsigned_long aa_1;
  DNN_NUMERIC *src_1;
  unsigned_long srcIndex_1;
  unsigned_long bb_1;
  unsigned_long cc;
  unsigned_long aa;
  DNN_NUMERIC *src;
  unsigned_long srcIndex;
  unsigned_long bb;
  DNN_NUMERIC *dst;
  DNN_NUMERIC *data;
  unsigned_long maxB;
  unsigned_long dstD;
  unsigned_long dstC;
  unsigned_long dstB;
  unsigned_long dstA;
  unsigned_long srcD;
  unsigned_long srcC;
  unsigned_long srcB;
  unsigned_long srcA;
  ulong local_f8;
  double *local_f0;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  unsigned_long in_stack_ffffffffffffff40;
  double *pdVar12;
  unsigned_long in_stack_ffffffffffffff48;
  TMatrix<double> *in_stack_ffffffffffffff50;
  ulong bb_00;
  TMatrix<double> *in_stack_ffffffffffffff60;
  ulong uVar13;
  unsigned_long in_stack_ffffffffffffff68;
  unsigned_long in_stack_ffffffffffffff70;
  unsigned_long in_stack_ffffffffffffff78;
  
  uVar2 = TMatrix<double>::aa(in_RSI);
  uVar3 = TMatrix<double>::bb(in_RSI);
  uVar4 = TMatrix<double>::cc(in_RSI);
  uVar5 = TMatrix<double>::dd(in_RSI);
  uVar6 = TMatrix<double>::aa(in_RDI);
  uVar7 = TMatrix<double>::bb(in_RDI);
  uVar8 = TMatrix<double>::cc(in_RDI);
  uVar9 = TMatrix<double>::dd(in_RDI);
  if ((((uVar2 < uVar6 + in_RDX) || (uVar3 < uVar7 + in_RCX)) || (uVar8 != uVar4)) ||
     (uVar5 != uVar9)) {
    bVar1 = report_problem("Error",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/Matrix.cpp"
                           ,"subsample",0x7c,"Matricies not compatible for subsample.");
  }
  else {
    uVar10 = uVar7 + in_RCX;
    pdVar11 = TMatrix<double>::dataReadOnly(in_RSI);
    this = (TMatrix<double> *)TMatrix<double>::data(in_RDI);
    if (uVar9 == 1) {
      if (uVar8 == 1) {
        for (; in_RCX < uVar10; in_RCX = in_RCX + 1) {
          uVar2 = TMatrix<double>::getIndex
                            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                             in_stack_ffffffffffffff40);
          pdVar12 = pdVar11 + uVar2;
          for (uVar13 = 0; uVar13 < uVar6; uVar13 = uVar13 + 1) {
            this->m_a = (unsigned_long)*pdVar12;
            pdVar12 = pdVar12 + 1;
            this = (TMatrix<double> *)&this->m_b;
          }
        }
        bVar1 = true;
      }
      else {
        for (uVar13 = 0; bb_00 = in_RCX, uVar13 < uVar8; uVar13 = uVar13 + 1) {
          for (; bb_00 < uVar10; bb_00 = bb_00 + 1) {
            in_stack_ffffffffffffff48 =
                 TMatrix<double>::getIndex
                           (in_stack_ffffffffffffff60,uVar13,bb_00,in_stack_ffffffffffffff48);
            pdVar12 = pdVar11 + in_stack_ffffffffffffff48;
            for (local_c8 = 0; local_c8 < uVar6; local_c8 = local_c8 + 1) {
              this->m_a = (unsigned_long)*pdVar12;
              pdVar12 = pdVar12 + 1;
              this = (TMatrix<double> *)&this->m_b;
            }
          }
        }
        bVar1 = true;
      }
    }
    else {
      for (local_d0 = 0; local_d0 < uVar9; local_d0 = local_d0 + 1) {
        for (local_d8 = 0; local_e0 = in_RCX, local_d8 < uVar8; local_d8 = local_d8 + 1) {
          for (; local_e0 < uVar10; local_e0 = local_e0 + 1) {
            uVar2 = TMatrix<double>::getIndex
                              (this,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                               in_stack_ffffffffffffff68,(unsigned_long)in_stack_ffffffffffffff60);
            local_f0 = pdVar11 + uVar2;
            for (local_f8 = 0; local_f8 < uVar6; local_f8 = local_f8 + 1) {
              this->m_a = (unsigned_long)*local_f0;
              local_f0 = local_f0 + 1;
              this = (TMatrix<double> *)&this->m_b;
            }
          }
        }
      }
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool
    subsample( Matrix &dstMatrix, const Matrix &srcMatrix, const unsigned long da, const unsigned long db ) {
        const unsigned long srcA  = srcMatrix.aa();     // X
        const unsigned long srcB  = srcMatrix.bb();     // Y
        const unsigned long srcC  = srcMatrix.cc();     // r,g,b channel (if image)
        const unsigned long srcD  = srcMatrix.dd();
        const unsigned long dstA  = dstMatrix.aa();
        const unsigned long dstB  = dstMatrix.bb();
        const unsigned long dstC  = dstMatrix.cc();
        const unsigned long dstD  = dstMatrix.dd();
        if(( dstA + da ) > srcA || (dstB + db ) > srcB || dstC != srcC || srcD != dstD ) {
            return log_error( "Matricies not compatible for subsample." );
        }
        const unsigned long maxB = dstB + db;
        const DNN_NUMERIC  *data = srcMatrix.dataReadOnly();
              DNN_NUMERIC  *dst  = dstMatrix.data();
        if( dstD == 1 ) {
            if( dstC == 1 ) {
                // 2D matrix( aa, bb )
                for( unsigned long bb = db; bb < maxB; bb++ ) {
                    const unsigned long srcIndex = srcMatrix.getIndex( da, bb );    // TODO: Speed up subsample
                    const DNN_NUMERIC *src = &data[srcIndex];
                    for( unsigned long aa = 0; aa < dstA; aa++ ) {
                        *dst++ = *src++;
                    }
                }
                return true;
            }
            // 3D matrix( aa, bb, cc )
            for( unsigned long cc = 0; cc < dstC; cc++ ) {
                for( unsigned long bb = db; bb < maxB; bb++ ) {
                    const unsigned long srcIndex = srcMatrix.getIndex( da, bb, cc );
                    const DNN_NUMERIC *src = &data[srcIndex];
                    for( unsigned long aa = 0; aa < dstA; aa++ ) {
                        *dst++ = *src++;
                    }
                }
            }
            return true;
        }
        // 4D matrix( aa, bb, cc, dd )
        for( unsigned long dd = 0; dd < dstD; dd++ ) {
            for( unsigned long cc = 0; cc < dstC; cc++ ) {
                for( unsigned long bb = db; bb < maxB; bb++ ) {
                    const unsigned long srcIndex = srcMatrix.getIndex( da, bb, cc, dd );
                    const DNN_NUMERIC *src = &data[srcIndex];
                    for( unsigned long aa = 0; aa < dstA; aa++ ) {
                        *dst++ = *src++;
                    }
                }
            }
        }
        return true;
    }